

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# subtype.cc
# Opt level: O2

void __thiscall verona::Sequent::Sequent(Sequent *this,Sequent *rhs)

{
  std::
  vector<std::shared_ptr<verona::BtypeDef>,_std::allocator<std::shared_ptr<verona::BtypeDef>_>_>::
  vector(&this->lhs_pending,&rhs->lhs_pending);
  std::
  vector<std::shared_ptr<verona::BtypeDef>,_std::allocator<std::shared_ptr<verona::BtypeDef>_>_>::
  vector(&this->rhs_pending,&rhs->rhs_pending);
  std::
  vector<std::shared_ptr<verona::BtypeDef>,_std::allocator<std::shared_ptr<verona::BtypeDef>_>_>::
  vector(&this->lhs_atomic,&rhs->lhs_atomic);
  std::
  vector<std::shared_ptr<verona::BtypeDef>,_std::allocator<std::shared_ptr<verona::BtypeDef>_>_>::
  vector(&this->rhs_atomic,&rhs->rhs_atomic);
  std::
  vector<std::shared_ptr<verona::BtypeDef>,_std::allocator<std::shared_ptr<verona::BtypeDef>_>_>::
  vector(&this->self,&rhs->self);
  std::
  vector<std::shared_ptr<verona::BtypeDef>,_std::allocator<std::shared_ptr<verona::BtypeDef>_>_>::
  vector(&this->predicates,&rhs->predicates);
  std::vector<verona::Assume,_std::allocator<verona::Assume>_>::vector
            (&this->assumptions,&rhs->assumptions);
  std::
  _Rb_tree<trieste::Location,_std::pair<const_trieste::Location,_verona::Bound>,_std::_Select1st<std::pair<const_trieste::Location,_verona::Bound>_>,_std::less<trieste::Location>,_std::allocator<std::pair<const_trieste::Location,_verona::Bound>_>_>
  ::_Rb_tree(&(this->bounds)._M_t,&(rhs->bounds)._M_t);
  return;
}

Assistant:

Sequent(Sequent& rhs)
    : lhs_pending(rhs.lhs_pending),
      rhs_pending(rhs.rhs_pending),
      lhs_atomic(rhs.lhs_atomic),
      rhs_atomic(rhs.rhs_atomic),
      self(rhs.self),
      predicates(rhs.predicates),
      assumptions(rhs.assumptions),
      bounds(rhs.bounds)
    {}